

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall mp::BasicSolver::PrintWarnings(BasicSolver *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string warnings;
  BasicCStringRef<char> *in_stack_ffffffffffffffa0;
  string local_50 [24];
  BasicSolver *in_stack_ffffffffffffffc8;
  CStringRef in_stack_ffffffffffffffd0;
  string local_28 [7];
  char in_stack_ffffffffffffffdf;
  
  GetWarnings_abi_cxx11_((BasicSolver *)warnings._M_string_length);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::operator+(in_stack_ffffffffffffffdf,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffffd0.data_);
    fmt::BasicCStringRef<char>::BasicCStringRef(in_stack_ffffffffffffffa0,in_RDI);
    Print<>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string(local_50);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void BasicSolver::PrintWarnings() {
  auto warnings = GetWarnings();
  if (warnings.size())
    Print('\n' + warnings);
}